

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileImporter::createTriangleTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,sQ3BSPFace *pQ3BSPFace,aiMesh *pMesh,
          uint *faceIdx,uint *vertIdx)

{
  aiVector3D *paVar1;
  float fVar2;
  uint uVar3;
  pointer ppsVar4;
  sQ3BSPVertex *psVar5;
  aiVector3D *paVar6;
  float fVar7;
  uint *puVar8;
  aiFace *paVar9;
  ulong uVar10;
  aiFace *paVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar3 = *faceIdx;
  if (uVar3 < pMesh->mNumFaces) {
    paVar9 = pMesh->mFaces;
    paVar11 = paVar9 + uVar3;
    *faceIdx = uVar3 + 1;
    this->m_pCurrentFace = paVar11;
    if (paVar9 != (aiFace *)0x0) {
      paVar11->mNumIndices = 3;
      paVar9 = this->m_pCurrentFace;
      puVar8 = (uint *)operator_new__((ulong)paVar9->mNumIndices << 2);
      paVar9->mIndices = puVar8;
      if (pQ3BSPFace->iNumOfFaceVerts != 0) {
        uVar10 = 0;
        uVar13 = 0;
        do {
          uVar12 = (long)(pModel->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)pQ3BSPFace->iFaceVertexIndex + uVar13] +
                   (long)pQ3BSPFace->iVertexIndex;
          ppsVar4 = (pModel->m_Vertices).
                    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((uVar12 < (ulong)((long)(pModel->m_Vertices).
                                      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar4 >>
                               3)) && (psVar5 = ppsVar4[uVar12], psVar5 != (sQ3BSPVertex *)0x0)) {
            if (2 < uVar10) {
              uVar3 = *faceIdx;
              if (uVar3 < pMesh->mNumFaces) {
                paVar9 = pMesh->mFaces + uVar3;
                *faceIdx = uVar3 + 1;
              }
              else {
                paVar9 = (aiFace *)0x0;
              }
              this->m_pCurrentFace = paVar9;
              if (paVar9 != (aiFace *)0x0) {
                paVar9->mNumIndices = 3;
                puVar8 = (uint *)operator_new__(0xc);
                this->m_pCurrentFace->mIndices = puVar8;
                *this->m_pCurrentFace->mIndices = *vertIdx;
              }
              uVar10 = 0;
            }
            paVar6 = pMesh->mVertices;
            uVar3 = *vertIdx;
            fVar7 = (psVar5->vPosition).y;
            fVar2 = (psVar5->vPosition).z;
            paVar1 = paVar6 + uVar3;
            paVar1->x = (psVar5->vPosition).x;
            paVar1->y = fVar7;
            paVar6[uVar3].z = fVar2;
            paVar6 = pMesh->mNormals;
            uVar3 = *vertIdx;
            fVar7 = (psVar5->vNormal).y;
            fVar2 = (psVar5->vNormal).z;
            paVar1 = paVar6 + uVar3;
            paVar1->x = (psVar5->vNormal).x;
            paVar1->y = fVar7;
            paVar6[uVar3].z = fVar2;
            paVar6 = pMesh->mTextureCoords[0];
            uVar3 = *vertIdx;
            fVar2 = (psVar5->vTexCoord).y;
            paVar1 = paVar6 + uVar3;
            paVar1->x = (psVar5->vTexCoord).x;
            paVar1->y = fVar2;
            paVar6[uVar3].z = 0.0;
            paVar6 = pMesh->mTextureCoords[1];
            uVar3 = *vertIdx;
            fVar2 = (psVar5->vLightmap).y;
            paVar1 = paVar6 + uVar3;
            paVar1->x = (psVar5->vLightmap).x;
            paVar1->y = fVar2;
            paVar6[uVar3].z = 0.0;
            *vertIdx = *vertIdx + 1;
            uVar10 = uVar10 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)(long)pQ3BSPFace->iNumOfFaceVerts);
      }
    }
    return;
  }
  __assert_fail("faceIdx < pMesh->mNumFaces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                ,0x178,
                "void Assimp::Q3BSPFileImporter::createTriangleTopology(const Q3BSP::Q3BSPModel *, sQ3BSPFace *, aiMesh *, unsigned int &, unsigned int &)"
               );
}

Assistant:

void Q3BSPFileImporter::createTriangleTopology( const Q3BSP::Q3BSPModel *pModel, sQ3BSPFace *pQ3BSPFace,
        aiMesh* pMesh, unsigned int &faceIdx, unsigned int &vertIdx ) {
    ai_assert( faceIdx < pMesh->mNumFaces );

    m_pCurrentFace = getNextFace( pMesh, faceIdx );
    if ( nullptr == m_pCurrentFace ) {
        return;
    }

    m_pCurrentFace->mNumIndices = 3;
    m_pCurrentFace->mIndices = new unsigned int[ m_pCurrentFace->mNumIndices ];

    size_t idx( 0 );
    for ( size_t i = 0; i < (size_t) pQ3BSPFace->iNumOfFaceVerts; ++i ) {
        const size_t index = pQ3BSPFace->iVertexIndex + pModel->m_Indices[ pQ3BSPFace->iFaceVertexIndex + i ];
        if ( index >= pModel->m_Vertices.size() ) {
            continue;
        }

        sQ3BSPVertex *pVertex = pModel->m_Vertices[ index ];
        if ( nullptr == pVertex ) {
            continue;
        }
        if (idx > 2) {
            idx = 0;
            m_pCurrentFace = getNextFace(pMesh, faceIdx);
            if (nullptr != m_pCurrentFace) {
                m_pCurrentFace->mNumIndices = 3;
                m_pCurrentFace->mIndices = new unsigned int[3];
                m_pCurrentFace->mIndices[ idx ] = vertIdx;
            }
        }

        pMesh->mVertices[ vertIdx ].Set( pVertex->vPosition.x, pVertex->vPosition.y, pVertex->vPosition.z );
        pMesh->mNormals[ vertIdx ].Set( pVertex->vNormal.x, pVertex->vNormal.y, pVertex->vNormal.z );

        pMesh->mTextureCoords[ 0 ][ vertIdx ].Set( pVertex->vTexCoord.x, pVertex->vTexCoord.y, 0.0f );
        pMesh->mTextureCoords[ 1 ][ vertIdx ].Set( pVertex->vLightmap.x, pVertex->vLightmap.y, 0.0f );

        vertIdx++;
        idx++;
    }
}